

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

void __thiscall
Wasm::WasmBytecodeGenerator::EmitReturnExpr
          (WasmBytecodeGenerator *this,PolymorphicEmitInfo *explicitRetInfo)

{
  EmitInfo EVar1;
  OpCodeAsmJs OVar2;
  EmitInfo EVar3;
  uint32 index;
  PolymorphicEmitInfo PVar4;
  EmitInfo local_50;
  EmitInfo info;
  PolymorphicEmitInfo retExprInfo;
  
  if (explicitRetInfo == (PolymorphicEmitInfo *)0x0) {
    PVar4._4_4_ = 0;
    PVar4.count = (this->m_funcBlock->yieldInfo).count;
    PVar4.field_1.infos = (this->m_funcBlock->yieldInfo).field_1.infos;
    PVar4 = PopStackPolymorphic(this,PVar4,(char16 *)0x0);
    EVar1.super_EmitInfoBase.location = PVar4.count;
    info.super_EmitInfoBase.location = EVar1.super_EmitInfoBase.location;
  }
  else {
    EVar1.super_EmitInfoBase.location = explicitRetInfo->count;
    EVar1.type = *(WasmType *)&explicitRetInfo->field_0x4;
    info = EVar1;
  }
  if (EVar1.super_EmitInfoBase.location != 0) {
    index = 0;
    do {
      EVar3 = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)&info,index);
      local_50 = EVar3;
      OVar2 = GetReturnOp(this,EVar3.type);
      (*this->m_writer->_vptr_IWasmByteCodeWriter[8])
                (this->m_writer,(ulong)OVar2,0,(ulong)EVar3 & 0xffffffff);
      ReleaseLocation(this,&local_50);
      index = index + 1;
    } while (EVar1.super_EmitInfoBase.location != index);
  }
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x19])
            (this->m_writer,(ulong)(uint)this->m_funcInfo->m_ExitLabel,0x25);
  SetUnreachableState(this,true);
  return;
}

Assistant:

void WasmBytecodeGenerator::EmitReturnExpr(PolymorphicEmitInfo* explicitRetInfo)
{
    PolymorphicEmitInfo retExprInfo = explicitRetInfo ? *explicitRetInfo : PopStackPolymorphic(m_funcBlock);
    for (uint32 i = 0; i < retExprInfo.Count(); ++i)
    {
        EmitInfo info = retExprInfo.GetInfo(i);
        Js::OpCodeAsmJs retOp = GetReturnOp(info.type);
        m_writer->Conv(retOp, 0, info.location);
        ReleaseLocation(&info);
    }
    m_writer->AsmBr(m_funcInfo->GetExitLabel());

    SetUnreachableState(true);
}